

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# DivideTest.h
# Opt level: O2

void __thiscall
DivideTest<long>::test_random_numerators<(libdivide::Branching)1>
          (DivideTest<long> *this,long denom,divider<long,_(libdivide::Branching)1> *the_divider)

{
  long numer;
  long lVar1;
  size_t i;
  long lVar2;
  
  for (lVar2 = 0; lVar1 = 8, lVar2 != 10000; lVar2 = lVar2 + 1) {
    while (lVar1 != 0) {
      numer = get_random(this);
      test_one<(libdivide::Branching)1>(this,numer,denom,the_divider);
      lVar1 = lVar1 + -1;
    }
  }
  return;
}

Assistant:

void test_random_numerators(T denom, const divider<T, ALGO> &the_divider) {
        for (size_t i = 0; i < 10000; ++i) {
            for (size_t j = 0; j < min_vector_count; j++) {
                test_one(get_random(), denom, the_divider);
            }
        }
    }